

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol_test.cpp
# Opt level: O1

string * CreatePacketV0(string *__return_storage_ptr__,string *user_data,size_t padding_size)

{
  pointer pcVar1;
  size_type sVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  pointer pcVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,
             (char)padding_size + (char)user_data->_M_string_length + '\x1d');
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  builtin_strncpy(pcVar1,"RN6U",5);
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  bVar3 = 0x18;
  lVar5 = 0;
  do {
    pcVar1[lVar5 + 9] = (char)(0x3039 >> (bVar3 & 0x1f));
    lVar5 = lVar5 + 1;
    bVar3 = bVar3 - 8;
  } while (lVar5 != 4);
  bVar3 = 0x18;
  lVar5 = 0;
  do {
    pcVar1[lVar5 + 0xd] = (char)(0xd431 >> (bVar3 & 0x1f));
    lVar5 = lVar5 + 1;
    bVar3 = bVar3 - 8;
  } while (lVar5 != 4);
  pcVar6 = pcVar1 + 0x11;
  lVar5 = 0x38;
  do {
    *pcVar6 = (char)(0x499602d2L >> ((byte)lVar5 & 0x3f));
    lVar5 = lVar5 + -8;
    pcVar6 = pcVar6 + 1;
  } while (lVar5 != -8);
  sVar2 = user_data->_M_string_length;
  pcVar6 = pcVar1 + 0x19;
  lVar5 = 8;
  do {
    *pcVar6 = (char)((ushort)sVar2 >> ((byte)lVar5 & 0x1f));
    pcVar6 = pcVar6 + 1;
    lVar5 = lVar5 + -8;
  } while (lVar5 == 0);
  pcVar6 = pcVar1 + 0x1b;
  lVar5 = 8;
  do {
    *pcVar6 = (char)(((uint)padding_size & 0xffff) >> ((byte)lVar5 & 0x1f));
    pcVar6 = pcVar6 + 1;
    lVar5 = lVar5 + -8;
  } while (lVar5 == 0);
  if (user_data->_M_string_length != 0) {
    uVar4 = 0;
    do {
      pcVar1[uVar4 + 0x1d] = (user_data->_M_dataplus)._M_p[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 < user_data->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CreatePacketV0(const std::string& user_data, size_t padding_size) {
  std::string result;
  result.resize(sizeof(PacketHeaderV0) + user_data.size() + padding_size);

  char* ptr = const_cast<char*>(result.data());
  PacketHeaderV0* packet_header = (PacketHeaderV0*)ptr;
  ptr += sizeof(PacketHeaderV0);

  packet_header->magic[0] = 'R';
  packet_header->magic[1] = 'N';
  packet_header->magic[2] = '6';
  packet_header->magic[3] = 'U';
  packet_header->reserved[0] = 0;
  packet_header->reserved[1] = 0;
  packet_header->reserved[2] = 0;
  packet_header->reserved[3] = 0;
  packet_header->packet_type = udpdiscovery::kPacketIAmHere;
  StoreBigEndian<uint32_t>(kApplicationId, &packet_header->application_id);
  StoreBigEndian<uint32_t>(kPeerId, &packet_header->peer_id);
  StoreBigEndian<uint64_t>(kSnapshotIndex, &packet_header->packet_index);
  StoreBigEndian<uint16_t>(user_data.size(), &packet_header->user_data_size);
  StoreBigEndian<uint16_t>(padding_size, &packet_header->padding_size);

  for (int i = 0; i < user_data.size(); ++i) {
    *ptr = user_data[i];
    ++ptr;
  }

  return result;
}